

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  EchoProgress *this_00;
  cmGlobalUnixMakefileGenerator3 *this_01;
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  bool bVar4;
  bool bVar5;
  bool forResponse;
  bool useWatcomQuote_00;
  int iVar6;
  char *pcVar7;
  string *psVar8;
  pointer pcVar9;
  undefined4 extraout_var;
  pointer pcVar10;
  string *relDir;
  iterator __first;
  iterator __last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  cmOutputConverter *local_908;
  cmOutputConverter *local_870;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_740;
  const_iterator local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_728;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_720;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_718;
  const_iterator local_710;
  char *local_708;
  char *name;
  reference local_6e0;
  string *real_link_command;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_6b0;
  char *local_690;
  char *val;
  string launcher;
  string targetOutPathCompilePDB;
  string targetFullPathCompilePDB;
  undefined1 local_608 [8];
  string target;
  undefined1 local_5e0 [4];
  OutputFormat output;
  string local_5c0;
  undefined1 local_5a0 [8];
  string objectDir;
  RuleVariables vars;
  string buildObjs;
  string linkLibs;
  cmStateDirectory local_400;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> local_3d8;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  undefined1 local_3a8 [5];
  bool useWatcomQuote;
  bool useResponseFileForLibs;
  bool useResponseFileForObjects;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string linkRule;
  undefined1 local_368 [8];
  string linkRuleVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  undefined1 local_328 [7];
  bool useLinkScript;
  undefined1 local_308 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  allocator<char> local_2c9;
  undefined1 local_2c8 [8];
  string export_flag_var;
  string linkFlags;
  string flags;
  string local_248;
  allocator<char> local_221;
  undefined1 local_220 [8];
  string buildEcho;
  EchoProgress progress;
  undefined1 local_1a0 [8];
  string targetOutputReal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_160;
  undefined1 local_140 [8];
  string objExt;
  undefined1 local_118 [8];
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_d8;
  char *local_b8;
  char *resolveDeviceSymbols;
  const_iterator cStack_a8;
  bool doDeviceLinking;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  byte local_81;
  LinkClosure *pLStack_80;
  bool hasCUDA;
  LinkClosure *closure;
  undefined1 local_70 [8];
  string cuda_lang;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  cmMakefileExecutableTargetGenerator *pcStack_10;
  bool relink_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  this_01 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
  local_11 = relink;
  pcStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CUDA",&local_39);
  bVar4 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)this_01,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"CUDA",(allocator<char> *)((long)&closure + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&closure + 7));
    pLStack_80 = cmGeneratorTarget::GetLinkClosure
                           ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget,
                            &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                             ConfigName);
    local_98._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pLStack_80->Languages);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&pLStack_80->Languages);
    local_90 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_98,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_a0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70);
    cStack_a8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&pLStack_80->Languages);
    local_81 = __gnu_cxx::operator!=(&local_90,&stack0xffffffffffffff58);
    resolveDeviceSymbols._7_1_ = 1;
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CUDA_RESOLVE_DEVICE_SYMBOLS",
               (allocator<char> *)
               ((long)&commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar7 = cmGeneratorTarget::GetProperty(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&commands.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_b8 = pcVar7;
    if (pcVar7 != (char *)0x0) {
      resolveDeviceSymbols._7_1_ = cmSystemTools::IsOn(pcVar7);
    }
    if (((local_81 & 1) == 0) || ((resolveDeviceSymbols._7_1_ & 1) == 0)) {
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkLanguage.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_118,"CUDA",(allocator<char> *)(objExt.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(objExt.field_2._M_local_buf + 0xf));
      pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"CMAKE_CUDA_OUTPUT_EXTENSION",
                 (allocator<char> *)
                 ((long)&depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      psVar8 = cmMakefile::GetSafeDefinition(pcVar2,&local_160);
      std::__cxx11::string::string((string *)local_140,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&targetOutputReal.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(pvVar11);
      cmMakefileTargetGenerator::AppendLinkDepends
                (&this->super_cmMakefileTargetGenerator,pvVar11,(string *)local_118);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&progress.Arg.field_2 + 8),
                     &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget)->ObjectDirectory,"cmake_device_link");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&progress.Arg.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
      ;
      std::__cxx11::string::~string((string *)(progress.Arg.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=((string *)&this->DeviceLinkObject,(string *)local_1a0);
      (this->super_cmMakefileTargetGenerator).NumberOfProgressActions =
           (this->super_cmMakefileTargetGenerator).NumberOfProgressActions + 1;
      if (((this->super_cmMakefileTargetGenerator).NoRuleMessages & 1U) == 0) {
        this_00 = (EchoProgress *)((long)&buildEcho.field_2 + 8);
        cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress(this_00);
        cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,this_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_220,"Linking ",&local_221);
        std::allocator<char>::~allocator(&local_221);
        std::__cxx11::string::operator+=((string *)local_220,(string *)local_118);
        std::__cxx11::string::operator+=((string *)local_220," device code ");
        pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)((long)&flags.field_2 + 8),(cmLocalGenerator *)pcVar3,psVar8,
                   &this->DeviceLinkObject);
        cmOutputConverter::ConvertToOutputFormat
                  (&local_248,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)((long)&flags.field_2 + 8),SHELL);
        std::__cxx11::string::operator+=((string *)local_220,(string *)&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
        cmLocalUnixMakefileGenerator3::AppendEcho
                  ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&linkLanguage.field_2 + 8),(string *)local_220,EchoLink,
                   (EchoProgress *)((long)&buildEcho.field_2 + 8));
        std::__cxx11::string::~string((string *)local_220);
        cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress
                  ((EchoProgress *)((long)&buildEcho.field_2 + 8));
      }
      std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(export_flag_var.field_2._M_local_buf + 8));
      bVar4 = cmGeneratorTarget::IsExecutableWithExports
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2c8,"CMAKE_EXE_EXPORTS_",&local_2c9);
        std::allocator<char>::~allocator(&local_2c9);
        std::__cxx11::string::operator+=((string *)local_2c8,(string *)local_118);
        std::__cxx11::string::operator+=((string *)local_2c8,"_FLAG");
        pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        pcVar7 = cmMakefile::GetDefinition
                           ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                            Makefile,(string *)local_2c8);
        (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
                  (pcVar3,(undefined1 *)((long)&export_flag_var.field_2 + 8),pcVar7);
        std::__cxx11::string::~string((string *)local_2c8);
      }
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      cmLocalGenerator::GetLinkLibsCMP0065
                ((string *)
                 &exeCleanFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmLocalGenerator *)pcVar3,
                 (string *)local_118,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget);
      (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar3,(undefined1 *)((long)&export_flag_var.field_2 + 8),
                 &exeCleanFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &exeCleanFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmLocalGenerator::AddLanguageFlagsForLinking
                ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (string *)((long)&linkFlags.field_2 + 8),
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,(string *)local_118,
                 &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
      cmLocalGenerator::AddArchitectureFlags
                ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (string *)((long)&linkFlags.field_2 + 8),
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,(string *)local_118,
                 &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
      cmMakefileTargetGenerator::GetTargetLinkFlags
                (&this->super_cmMakefileTargetGenerator,
                 (string *)((long)&export_flag_var.field_2 + 8),(string *)local_118);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_308);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)local_328,(cmLocalGenerator *)pcVar3,psVar8,(string *)local_1a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_308,(value_type *)local_328);
      std::__cxx11::string::~string((string *)local_328);
      bVar4 = cmGlobalGenerator::GetUseLinkScript
                        ((cmGlobalGenerator *)
                         (this->super_cmMakefileTargetGenerator).GlobalGenerator);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkRuleVar.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",
                 (allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
      cmMakefileTargetGenerator::GetLinkRule
                ((string *)
                 &commands1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 &this->super_cmMakefileTargetGenerator,(string *)local_368);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3a8);
      cmSystemTools::ExpandListArgument
                ((string *)
                 &commands1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkRuleVar.field_2 + 8),false);
      bVar5 = cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                        (&this->super_cmMakefileTargetGenerator,(string *)local_118);
      forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                              (&this->super_cmMakefileTargetGenerator,(string *)local_118);
      pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &linkLineComputer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     "_USE_WATCOM_QUOTE");
      useWatcomQuote_00 = cmMakefile::IsOn(pcVar2,(string *)&linkLineComputer);
      std::__cxx11::string::~string((string *)&linkLineComputer);
      cmOutputConverter::SetLinkScriptShell
                (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,bVar4
                );
      pcVar9 = (pointer)operator_new(0x40);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      local_870 = (cmOutputConverter *)0x0;
      if (pcVar3 != (cmLocalUnixMakefileGenerator3 *)0x0) {
        local_870 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)((long)&linkLibs.field_2 + 8),
                 (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
      cmStateSnapshot::GetDirectory(&local_400,(cmStateSnapshot *)((long)&linkLibs.field_2 + 8));
      cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
                ((cmLinkLineDeviceComputer *)pcVar9,local_870,&local_400);
      std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
      unique_ptr<std::default_delete<cmLinkLineComputer>,void>
                ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)
                 &local_3d8,pcVar9);
      pcVar9 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
               operator->(&local_3d8);
      cmLinkLineComputer::SetForResponse(pcVar9,forResponse);
      pcVar9 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
               operator->(&local_3d8);
      cmLinkLineComputer::SetUseWatcomQuote(pcVar9,useWatcomQuote_00);
      pcVar9 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
               operator->(&local_3d8);
      cmLinkLineComputer::SetRelink(pcVar9,(bool)(local_11 & 1));
      std::__cxx11::string::string((string *)(buildObjs.field_2._M_local_buf + 8));
      pcVar9 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                         (&local_3d8);
      cmMakefileTargetGenerator::CreateLinkLibs
                (&this->super_cmMakefileTargetGenerator,pcVar9,
                 (string *)(buildObjs.field_2._M_local_buf + 8),forResponse,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&targetOutputReal.field_2 + 8));
      std::__cxx11::string::string((string *)&vars.SwiftPartialModules);
      cmMakefileTargetGenerator::CreateObjectLists
                (&this->super_cmMakefileTargetGenerator,bVar4,false,bVar5,
                 (string *)&vars.SwiftPartialModules,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&targetOutputReal.field_2 + 8),useWatcomQuote_00);
      cmRulePlaceholderExpander::RuleVariables::RuleVariables
                ((RuleVariables *)((long)&objectDir.field_2 + 8));
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                ((string *)local_5a0,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)local_5e0,(cmLocalGenerator *)pcVar3,psVar8,(string *)local_5a0);
      cmOutputConverter::ConvertToOutputFormat
                (&local_5c0,
                 &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_5e0,SHELL);
      std::__cxx11::string::operator=((string *)local_5a0,(string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)local_5e0);
      target.field_2._12_4_ = ZEXT14(useWatcomQuote_00);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)((long)&targetFullPathCompilePDB.field_2 + 8),(cmLocalGenerator *)pcVar3,
                 psVar8,(string *)local_1a0);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)local_608,
                 &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)((long)&targetFullPathCompilePDB.field_2 + 8),
                 target.field_2._12_4_);
      std::__cxx11::string::~string((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
      cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
                ((string *)((long)&targetOutPathCompilePDB.field_2 + 8),
                 (cmCommonTargetGenerator *)this);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)((long)&launcher.field_2 + 8),
                 &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
                 (string *)((long)&targetOutPathCompilePDB.field_2 + 8),SHELL);
      vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
      vars.Language = (char *)std::__cxx11::string::c_str();
      vars.Object = (char *)std::__cxx11::string::c_str();
      vars.Objects = (char *)std::__cxx11::string::c_str();
      vars.Target = (char *)std::__cxx11::string::c_str();
      vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
      vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
      vars.TargetPDB = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::string((string *)&val);
      pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
      ;
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b0,"RULE_LAUNCH_LINK",
                 (allocator<char> *)
                 ((long)&rulePlaceholderExpander._M_t.
                         super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                         .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7
                 ));
      pcVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar3,pcVar1,&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&rulePlaceholderExpander._M_t.
                         super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                         .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7
                 ));
      local_690 = pcVar7;
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
        std::__cxx11::string::operator=((string *)&val,pcVar7);
        std::__cxx11::string::operator+=((string *)&val," ");
      }
      iVar6 = (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
      std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
      unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
                ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                  *)&__range1,(pointer)CONCAT44(extraout_var,iVar6));
      pcVar10 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&__range1);
      cmRulePlaceholderExpander::SetTargetImpLib(pcVar10,(string *)local_1a0);
      pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&linkRuleVar.field_2 + 8);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar11);
      real_link_command =
           (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(pvVar11);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&real_link_command), bVar5) {
        local_6e0 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       local_6e0);
        std::__cxx11::string::operator=((string *)local_6e0,(string *)&name);
        std::__cxx11::string::~string((string *)&name);
        pcVar10 = std::
                  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                  ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                *)&__range1);
        pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        local_908 = (cmOutputConverter *)0x0;
        if (pcVar3 != (cmLocalUnixMakefileGenerator3 *)0x0) {
          local_908 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                       super_cmOutputConverter;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (pcVar10,local_908,local_6e0,(RuleVariables *)((long)&objectDir.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      cmOutputConverter::SetLinkScriptShell
                (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false
                );
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   *)&__range1);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(targetOutPathCompilePDB.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_608);
      std::__cxx11::string::~string((string *)local_5a0);
      std::__cxx11::string::~string((string *)&vars.SwiftPartialModules);
      std::__cxx11::string::~string((string *)(buildObjs.field_2._M_local_buf + 8));
      std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
                (&local_3d8);
      if (bVar4) {
        local_708 = "dlink.txt";
        if ((local_11 & 1) != 0) {
          local_708 = "drelink.txt";
        }
        cmMakefileTargetGenerator::CreateLinkScript
                  (&this->super_cmMakefileTargetGenerator,local_708,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&linkRuleVar.field_2 + 8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&targetOutputReal.field_2 + 8));
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3a8,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&linkRuleVar.field_2 + 8));
      }
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile);
      relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator
                         );
      cmLocalUnixMakefileGenerator3::CreateCDCommand
                (pcVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3a8,psVar8,relDir);
      local_718._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(linkLanguage.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_710,&local_718);
      local_720._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3a8);
      local_728 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3a8);
      local_730 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             (linkLanguage.field_2._M_local_buf + 8),local_710,local_720,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_728);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3a8);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
                 (string *)local_1a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&targetOutputReal.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkLanguage.field_2 + 8),false,false);
      cmMakefileTargetGenerator::WriteTargetDriverRule
                (&this->super_cmMakefileTargetGenerator,(string *)local_1a0,(bool)(local_11 & 1));
      pvVar11 = &(this->super_cmMakefileTargetGenerator).CleanFiles;
      local_740._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(pvVar11);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_738,&local_740);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_308);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_308);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar11,
                 local_738,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3a8);
      std::__cxx11::string::~string
                ((string *)
                 &commands1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_368);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&linkRuleVar.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_308);
      std::__cxx11::string::~string((string *)(export_flag_var.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&targetOutputReal.field_2 + 8));
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)local_118);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&linkLanguage.field_2 + 8));
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (!this->GlobalGenerator->GetLanguageEnabled("CUDA")) {
    return;
  }

  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    this->GeneratorTarget->GetLinkClosure(this->ConfigName);

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());

  bool doDeviceLinking = true;
  if (const char* resolveDeviceSymbols =
        this->GeneratorTarget->GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
  }
  if (!hasCUDA || !doDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the language to use for linking this library.
  std::string linkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Get the name of the device object to generate.
  std::string const targetOutputReal =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutputReal;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " device code ";
    buildEcho += this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(),
        this->DeviceLinkObject),
      cmOutputConverter::SHELL);
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  // Add symbol export flags if necessary.
  if (this->GeneratorTarget->IsExecutableWithExports()) {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags(
      linkFlags, this->Makefile->GetDefinition(export_flag_var));
  }

  this->LocalGenerator->AppendFlags(linkFlags,
                                    this->LocalGenerator->GetLinkLibsCMP0065(
                                      linkLanguage, *this->GeneratorTarget));

  // Add language feature flags.
  this->LocalGenerator->AddLanguageFlagsForLinking(
    flags, this->GeneratorTarget, linkLanguage, this->ConfigName);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->GetTargetLinkFlags(linkFlags, linkLanguage);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->LocalGenerator->MaybeConvertToRelativePath(
    this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    bool useWatcomQuote =
      this->Makefile->IsOn(linkRuleVar + "_USE_WATCOM_QUOTE");

    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetUseWatcomQuote(useWatcomQuote);
    linkLineComputer->SetRelink(relink);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(linkLineComputer.get(), linkLibs,
                         useResponseFileForLibs, depends);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(useLinkScript, false, useResponseFileForObjects,
                            buildObjs, depends, useWatcomQuote);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), objectDir),
      cmOutputConverter::SHELL);

    cmOutputConverter::OutputFormat output = (useWatcomQuote)
      ? cmOutputConverter::WATCOMQUOTE
      : cmOutputConverter::SHELL;
    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal),
      output);

    std::string targetFullPathCompilePDB = this->ComputeTargetCompilePDB();
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.Flags = flags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    const char* val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutputReal);
    for (std::string& real_link_command : real_link_commands) {
      real_link_command = launcher + real_link_command;
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutputReal, depends, commands,
                                      false);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutputReal, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(this->CleanFiles.end(), exeCleanFiles.begin(),
                          exeCleanFiles.end());
#else
  static_cast<void>(relink);
#endif
}